

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall QAnimationTimer::restartAnimationTimer(QAnimationTimer *this)

{
  int duration;
  QAbstractAnimationTimer *unaff_retaddr;
  
  if ((*(int *)(this + 0x58) == 0) && (*(long *)(this + 0x70) != 0)) {
    duration = closestPauseAnimationTimeToFinish(this);
    QUnifiedTimer::pauseAnimationTimer((QAbstractAnimationTimer *)this,duration);
    return;
  }
  if (this[0x11] == (QAnimationTimer)0x1) {
    QUnifiedTimer::resumeAnimationTimer(unaff_retaddr);
    return;
  }
  if (this[0x10] != (QAnimationTimer)0x0) {
    return;
  }
  QUnifiedTimer::startAnimationTimer((QAbstractAnimationTimer *)this);
  return;
}

Assistant:

void QAnimationTimer::restartAnimationTimer()
{
    if (runningLeafAnimations == 0 && !runningPauseAnimations.isEmpty())
        QUnifiedTimer::pauseAnimationTimer(this, closestPauseAnimationTimeToFinish());
    else if (isPaused)
        QUnifiedTimer::resumeAnimationTimer(this);
    else if (!isRegistered)
        QUnifiedTimer::startAnimationTimer(this);
}